

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::BuildTLAS
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,BuildTLASAttribs *Attribs,
          int param_2)

{
  Uint32 *pUVar1;
  COMMAND_QUEUE_TYPE CVar2;
  bool bVar3;
  COMMAND_QUEUE_TYPE Type;
  COMMAND_QUEUE_TYPE extraout_DL;
  COMMAND_QUEUE_TYPE extraout_DL_00;
  char (*in_R9) [8];
  string msg;
  string local_58;
  String local_38;
  
  Type = (COMMAND_QUEUE_TYPE)param_2;
  if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
    if ((this->m_Desc).IsDeferred == false) {
      FormatString<char[79]>
                (&local_58,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"BuildTLAS",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x799);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    FormatString<char[97]>
              (&local_58,
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"BuildTLAS",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x799);
    Type = extraout_DL;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      Type = extraout_DL_00;
    }
  }
  CVar2 = (this->m_Desc).QueueType;
  if ((~CVar2 & 3) != 0) {
    GetCommandQueueTypeString_abi_cxx11_(&local_38,(Diligent *)(ulong)CVar2,Type);
    FormatString<char[10],char[22],std::__cxx11::string,char[8]>
              (&local_58,(Diligent *)"BuildTLAS",(char (*) [10])0x7699da,(char (*) [22])&local_38,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"BuildTLAS",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x799);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  if ((((this->m_pDevice).m_pObject)->
      super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
      ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Features.RayTracing ==
      DEVICE_FEATURE_STATE_DISABLED) {
    FormatString<char[71]>
              (&local_58,
               (char (*) [71])
               "IDeviceContext::BuildTLAS: ray tracing is not supported by this device");
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"BuildTLAS",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x79a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_pActiveRenderPass).m_pObject != (RenderPassVkImpl *)0x0) {
    FormatString<char[75]>
              (&local_58,
               (char (*) [75])
               "IDeviceContext::BuildTLAS command must be performed outside of render pass");
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"BuildTLAS",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x79b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  bVar3 = VerifyBuildTLASAttribs
                    (Attribs,&(((this->m_pDevice).m_pObject)->
                              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                              ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.
                              RayTracing);
  if (!bVar3) {
    FormatString<char[29]>(&local_58,(char (*) [29])"BuildTLASAttribs are invalid");
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"BuildTLAS",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x79c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  pUVar1 = &(this->m_Stats).CommandCounters.BuildTLAS;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

void DeviceContextBase<ImplementationTraits>::BuildTLAS(const BuildTLASAttribs& Attribs, int)
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_COMPUTE, "BuildTLAS");
    DEV_CHECK_ERR(m_pDevice->GetFeatures().RayTracing, "IDeviceContext::BuildTLAS: ray tracing is not supported by this device");
    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr, "IDeviceContext::BuildTLAS command must be performed outside of render pass");
    DEV_CHECK_ERR(VerifyBuildTLASAttribs(Attribs, m_pDevice->GetAdapterInfo().RayTracing), "BuildTLASAttribs are invalid");

    ++m_Stats.CommandCounters.BuildTLAS;
}